

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
find<0ul,char_const(&)[4]>
          (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *this,
          char (*params) [7])

{
  long lVar1;
  char (*in_RDX) [7];
  ArrayPtr<kj::StringPtr> table;
  char local_28;
  size_t local_20;
  
  table.ptr = params[4] + 4;
  table.size_ = *(size_t *)params;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher>::find<kj::StringPtr,char_const(&)[4]>
            ((HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)&local_28,table,in_RDX);
  if (local_28 == '\x01') {
    lVar1 = local_20 * 0x10 + *(long *)params;
  }
  else {
    lVar1 = 0;
  }
  *(long *)this = lVar1;
  return (Maybe<kj::StringPtr_&>)(StringPtr *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}